

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipcommunication.c
# Opt level: O0

int ipcmd_recv_tcp(ipcmd_t *ipcmd,YPSpur_msg *data)

{
  uchar *puVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  ssize_t sVar6;
  fd_set *__arr;
  uint __i;
  int nfds;
  uint addr_size;
  int recved;
  size_t len;
  int i;
  int sock;
  sockaddr_in client;
  fd_set fds;
  YPSpur_msg *data_local;
  ipcmd_t *ipcmd_local;
  
  _addr_size = 0x38;
  if ((ipcmd != (ipcmd_t *)0x0) && (ipcmd->connection_error == 0)) {
    while( true ) {
      __arr._4_4_ = 0;
      for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
        puVar1 = client.sin_zero + (ulong)(uint)__arr * 8;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
      }
      lVar4 = (long)(ipcmd->socket / 0x40);
      *(ulong *)(client.sin_zero + lVar4 * 8) =
           1L << ((byte)((long)ipcmd->socket % 0x40) & 0x3f) |
           *(ulong *)(client.sin_zero + lVar4 * 8);
      if (0 < ipcmd->socket) {
        __arr._4_4_ = ipcmd->socket;
      }
      for (len._0_4_ = 0; (int)(uint)len < 0x40; len._0_4_ = (uint)len + 1) {
        if ((ipcmd->clients[(int)(uint)len] != -1) &&
           (lVar4 = (long)(ipcmd->clients[(int)(uint)len] / 0x40),
           *(ulong *)(client.sin_zero + lVar4 * 8) =
                1L << ((byte)((long)ipcmd->clients[(int)(uint)len] % 0x40) & 0x3f) |
                *(ulong *)(client.sin_zero + lVar4 * 8),
           __arr._4_4_ < ipcmd->clients[(int)(uint)len])) {
          __arr._4_4_ = ipcmd->clients[(int)(uint)len];
        }
      }
      iVar3 = select(__arr._4_4_ + 1,(fd_set *)client.sin_zero,(fd_set *)0x0,(fd_set *)0x0,
                     (timeval *)0x0);
      if (iVar3 == 0) {
        yprintf(OUTPUT_LV_ERROR,"Couldn\'t select the socket.\n");
        return -1;
      }
      if (((*(ulong *)(client.sin_zero + (long)(ipcmd->socket / 0x40) * 8) &
           1L << ((byte)((long)ipcmd->socket % 0x40) & 0x3f)) == 0) ||
         (ipcmd->tcp_type == IPCMD_TCP_CLIENT)) {
        nfds = -1;
        if (ipcmd->tcp_type != IPCMD_TCP_CLIENT) {
          len._0_4_ = 0;
          goto LAB_001070c5;
        }
        sVar6 = recv(ipcmd->socket,data,_addr_size,0);
        nfds = (int)sVar6;
        data->pid = 0;
        goto LAB_0010717e;
      }
      __i = 0x10;
      len._4_4_ = accept(ipcmd->socket,(sockaddr *)&i,&__i);
      if (len._4_4_ < 1) {
        yprintf(OUTPUT_LV_ERROR,"Invalid socket.\n");
        return -1;
      }
      for (len._0_4_ = 0;
          (uVar2 = (uint)len, (int)(uint)len < 0x40 && (ipcmd->clients[(int)(uint)len] != -1));
          len._0_4_ = (uint)len + 1) {
      }
      if ((uint)len == 0x40) break;
      ipcmd->clients[(int)(uint)len] = len._4_4_;
      pcVar5 = inet_ntoa((in_addr)sock);
      yprintf(OUTPUT_LV_INFO,"Connection %d accepted from %s.\n",(ulong)uVar2,pcVar5);
    }
    yprintf(OUTPUT_LV_ERROR,"Too many connection requests.\n");
  }
  return -1;
LAB_001070c5:
  if (0x3f < (int)(uint)len) {
LAB_0010717e:
    if (nfds < 1) {
      if (ipcmd->tcp_type == IPCMD_TCP_CLIENT) {
        yprintf(OUTPUT_LV_INFO,"Connection closed.\n");
        ipcmd->connection_error = 1;
        shutdown(ipcmd->socket,2);
        return -1;
      }
      yprintf(OUTPUT_LV_INFO,"Connection %d closed.\n",(ulong)(uint)len);
      ipcmd->clients[(int)(uint)len] = -1;
    }
    return (int)_addr_size;
  }
  if ((*(ulong *)(client.sin_zero + (long)(ipcmd->clients[(int)(uint)len] / 0x40) * 8) &
      1L << ((byte)((long)ipcmd->clients[(int)(uint)len] % 0x40) & 0x3f)) != 0) {
    sVar6 = recv(ipcmd->clients[(int)(uint)len],data,_addr_size,0);
    nfds = (int)sVar6;
    data->pid = (long)(int)(uint)len;
    goto LAB_0010717e;
  }
  len._0_4_ = (uint)len + 1;
  goto LAB_001070c5;
}

Assistant:

int ipcmd_recv_tcp(struct ipcmd_t* ipcmd, YPSpur_msg* data)
{
  fd_set fds;
  struct sockaddr_in client;
  int sock;
  int i;
  size_t len = sizeof(YPSpur_msg);

  if (ipcmd == NULL || ipcmd->connection_error)
    return -1;

  do
  {
    int recved;
    while (1)
    {
      SIZE_TYPE addr_size;
      int nfds = 0;

      FD_ZERO(&fds);
      FD_SET(ipcmd->socket, &fds);
      if (nfds < ipcmd->socket)
        nfds = ipcmd->socket;
      for (i = 0; i < YPSPUR_MAX_SOCKET; i++)
      {
        if (ipcmd->clients[i] != -1)
        {
          FD_SET(ipcmd->clients[i], &fds);
          if (nfds < ipcmd->clients[i])
            nfds = ipcmd->clients[i];
        }
      }

      nfds++;
      if (!select(nfds, &fds, NULL, NULL, NULL))
      {
        yprintf(OUTPUT_LV_ERROR, "Couldn't select the socket.\n");
        return -1;
      }
      if (!FD_ISSET(ipcmd->socket, &fds))
      {
        break;
      }
      if (ipcmd->tcp_type == IPCMD_TCP_CLIENT)
      {
        break;
      }

      addr_size = sizeof(client);
      sock = accept(ipcmd->socket, (struct sockaddr*)&client, &addr_size);
      if (sock <= 0)
      {
        yprintf(OUTPUT_LV_ERROR, "Invalid socket.\n");
        return -1;
      }
      for (i = 0; i < YPSPUR_MAX_SOCKET; i++)
      {
        if (ipcmd->clients[i] == -1)
        {
          break;
        }
      }
      if (i == YPSPUR_MAX_SOCKET)
      {
        yprintf(OUTPUT_LV_ERROR, "Too many connection requests.\n");
        return -1;
      }
      ipcmd->clients[i] = sock;
      yprintf(OUTPUT_LV_INFO, "Connection %d accepted from %s.\n", i, inet_ntoa(client.sin_addr));
    }

    recved = -1;
    if (ipcmd->tcp_type == IPCMD_TCP_CLIENT)
    {
      recved = recv(ipcmd->socket, (SOCK_DATATYPE)data, len, 0);
      data->pid = 0;
    }
    else
    {
      for (i = 0; i < YPSPUR_MAX_SOCKET; i++)
      {
        if (FD_ISSET(ipcmd->clients[i], &fds))
        {
          recved = recv(ipcmd->clients[i], (SOCK_DATATYPE)data, len, 0);
          data->pid = i;
          break;
        }
      }
    }
    if (recved <= 0)
    {
      if (ipcmd->tcp_type == IPCMD_TCP_CLIENT)
      {
        yprintf(OUTPUT_LV_INFO, "Connection closed.\n");
        ipcmd->connection_error = 1;
        shutdown(ipcmd->socket, SOCK_SHUTDOWN_OPTION);
        return -1;
      }
      yprintf(OUTPUT_LV_INFO, "Connection %d closed.\n", i);
      ipcmd->clients[i] = -1;
      continue;
    }
  }
  while (0);
  return len;
}